

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::get_hash_for_pipeline_library_handle
          (StateRecorder *this,VkPipeline pipeline,Hash *hash)

{
  VkPipeline pVVar1;
  bool bVar2;
  _Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false> _Var3;
  long *in_FS_OFFSET;
  VkPipeline local_18;
  
  local_18 = pipeline;
  _Var3._M_cur = (__node_type *)
                 std::
                 _Hashtable<VkPipeline_T_*,_std::pair<VkPipeline_T_*const,_unsigned_long>,_std::allocator<std::pair<VkPipeline_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkPipeline_T_*>,_std::hash<VkPipeline_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->impl->raytracing_pipeline_to_hash)._M_h,&local_18);
  if ((_Var3._M_cur != (__node_type *)0x0) ||
     (_Var3._M_cur = (__node_type *)
                     std::
                     _Hashtable<VkPipeline_T_*,_std::pair<VkPipeline_T_*const,_unsigned_long>,_std::allocator<std::pair<VkPipeline_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkPipeline_T_*>,_std::hash<VkPipeline_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&(this->impl->graphics_pipeline_to_hash)._M_h,&local_18),
     pVVar1 = local_18, _Var3._M_cur != (__node_type *)0x0)) {
    *hash = *(Hash *)((long)&((_Var3._M_cur)->
                             super__Hash_node_value<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<VkPipeline_T_*const,_unsigned_long>_>
                             ._M_storage._M_storage + 8);
    return true;
  }
  if (1 < *(int *)(*in_FS_OFFSET + -0x18)) {
    return false;
  }
  bVar2 = Internal::log_thread_callback
                    (LOG_DEFAULT,
                     "%s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
                     ,"Pipeline library",local_18);
  if (bVar2) {
    return false;
  }
  fprintf(_stderr,
          "Fossilize WARN: %s handle 0x%016lx is not registered.\nIt has either not been recorded, or it failed to be recorded earlier (which is expected if application uses an extension that is not recognized by Fossilize).\n"
          ,"Pipeline library",pVVar1);
  return false;
}

Assistant:

bool StateRecorder::get_hash_for_pipeline_library_handle(VkPipeline pipeline, Hash *hash) const
{
	auto itr = impl->raytracing_pipeline_to_hash.find(pipeline);
	if (itr != end(impl->raytracing_pipeline_to_hash))
	{
		*hash = itr->second;
		return true;
	}

	itr = impl->graphics_pipeline_to_hash.find(pipeline);
	if (itr != end(impl->graphics_pipeline_to_hash))
	{
		*hash = itr->second;
		return true;
	}

	log_failed_hash("Pipeline library", pipeline);
	return false;
}